

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fps.c
# Opt level: O1

void destroy_fps(FPS *fps)

{
  free(fps->samples);
  fps->samples = (int *)0x0;
  fps->nSamples = 0;
  fps->frameCounter = 0;
  free(fps);
  return;
}

Assistant:

void destroy_fps(FPS * fps)
{
   free(fps->samples);
   fps->samples = NULL;
   fps->nSamples = 0;
   fps->frameCounter = 0;
   free(fps);
   fps = NULL;
}